

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSAPrivateKey.cpp
# Opt level: O0

ByteString * __thiscall OSSLRSAPrivateKey::PKCS8Encode(OSSLRSAPrivateKey *this)

{
  int iVar1;
  int iVar2;
  PKCS8_PRIV_KEY_INFO *this_00;
  long in_RSI;
  ByteString *in_RDI;
  int len2;
  uchar *priv;
  int len;
  PKCS8_PRIV_KEY_INFO *p8inf;
  EVP_PKEY *pkey;
  ByteString *der;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  ByteString *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uchar *local_48;
  int local_3c;
  PKCS8_PRIV_KEY_INFO *local_38;
  EVP_PKEY *local_30;
  undefined1 local_11;
  
  local_11 = 0;
  ByteString::ByteString((ByteString *)0x13af8e);
  if (*(long *)(in_RSI + 0x148) == 0) {
    createOSSLKey((OSSLRSAPrivateKey *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                 );
  }
  if ((*(long *)(in_RSI + 0x148) != 0) && (local_30 = EVP_PKEY_new(), local_30 != (EVP_PKEY *)0x0))
  {
    iVar1 = EVP_PKEY_set1_RSA(local_30,*(rsa_st **)(in_RSI + 0x148));
    if (iVar1 == 0) {
      EVP_PKEY_free(local_30);
    }
    else {
      this_00 = EVP_PKEY2PKCS8(local_30);
      local_38 = this_00;
      EVP_PKEY_free(local_30);
      if (local_38 != (PKCS8_PRIV_KEY_INFO *)0x0) {
        iVar1 = i2d_PKCS8_PRIV_KEY_INFO(local_38,(uchar **)0x0);
        local_3c = iVar1;
        if (iVar1 < 0) {
          PKCS8_PRIV_KEY_INFO_free(local_38);
        }
        else {
          ByteString::resize(in_stack_ffffffffffffff70,
                             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          local_48 = ByteString::operator[]
                               (in_stack_ffffffffffffff70,
                                CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          iVar2 = i2d_PKCS8_PRIV_KEY_INFO(local_38,&local_48);
          PKCS8_PRIV_KEY_INFO_free(local_38);
          if (iVar2 != local_3c) {
            ByteString::wipe((ByteString *)this_00,CONCAT44(iVar1,in_stack_ffffffffffffff78));
          }
        }
      }
    }
  }
  return in_RDI;
}

Assistant:

ByteString OSSLRSAPrivateKey::PKCS8Encode()
{
	ByteString der;
	if (rsa == NULL) createOSSLKey();
	if (rsa == NULL) return der;
	EVP_PKEY* pkey = EVP_PKEY_new();
	if (pkey == NULL) return der;
	if (!EVP_PKEY_set1_RSA(pkey, rsa))
	{
		EVP_PKEY_free(pkey);
		return der;
	}
	PKCS8_PRIV_KEY_INFO* p8inf = EVP_PKEY2PKCS8(pkey);
	EVP_PKEY_free(pkey);
	if (p8inf == NULL) return der;
	int len = i2d_PKCS8_PRIV_KEY_INFO(p8inf, NULL);
	if (len < 0)
	{
		PKCS8_PRIV_KEY_INFO_free(p8inf);
		return der;
	}
	der.resize(len);
	unsigned char* priv = &der[0];
	int len2 = i2d_PKCS8_PRIV_KEY_INFO(p8inf, &priv);
	PKCS8_PRIV_KEY_INFO_free(p8inf);
	if (len2 != len) der.wipe();
	return der;
}